

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5UnicodeAscii(u8 *aArray,u8 *aAscii)

{
  u8 uVar1;
  int iVar2;
  int n;
  int bToken;
  int iTbl;
  int i;
  u8 *aAscii_local;
  u8 *aArray_local;
  
  i = 0;
  iTbl = 0;
  while (i < 0x80) {
    uVar1 = aArray[(int)(aFts5UnicodeData[iTbl] & 0x1f)];
    iVar2 = ((int)(uint)aFts5UnicodeData[iTbl] >> 5) + i;
    for (; i < 0x80 && i < iVar2; i = i + 1) {
      aAscii[i] = uVar1;
    }
    iTbl = iTbl + 1;
  }
  *aAscii = '\0';
  return;
}

Assistant:

static void sqlite3Fts5UnicodeAscii(u8 *aArray, u8 *aAscii){
  int i = 0;
  int iTbl = 0;
  while( i<128 ){
    int bToken = aArray[ aFts5UnicodeData[iTbl] & 0x1F ];
    int n = (aFts5UnicodeData[iTbl] >> 5) + i;
    for(; i<128 && i<n; i++){
      aAscii[i] = (u8)bToken;
    }
    iTbl++;
  }
  aAscii[0] = 0;                  /* 0x00 is never a token character */
}